

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkdetheme.cpp
# Opt level: O3

QPalette * __thiscall QKdeTheme::palette(QKdeTheme *this,Palette type)

{
  int iVar1;
  QPlatformThemePrivate *pQVar2;
  QDebug QVar3;
  QPalette *pQVar4;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QDebug local_70;
  QDebug local_68;
  QDebug local_60;
  QDebug local_58;
  QDebug local_50;
  QArrayData *local_48 [3];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->super_QGenericUnixTheme).super_QPlatformTheme.d_ptr.d;
  iVar1 = *(int *)((long)&pQVar2[5].systemPalette + 4);
  if ((iVar1 == 0) || (iVar1 == *(int *)&pQVar2[5].systemPalette)) {
    pQVar4 = (QPalette *)pQVar2[5].name.d.d;
  }
  else {
    lcQpaThemeKde();
    if (((byte)lcQpaThemeKde::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      QMessageLogger::debug();
      QVar3.stream = local_70.stream;
      QVar5.m_data = (storage_type *)0x38;
      QVar5.m_size = (qsizetype)local_48;
      QString::fromUtf8(QVar5);
      QTextStream::operator<<(&(QVar3.stream)->ts,(QString *)local_48);
      if (local_48[0] != (QArrayData *)0x0) {
        LOCK();
        (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_48[0],2,0x10);
        }
      }
      if ((local_70.stream)->space == true) {
        QTextStream::operator<<(&(local_70.stream)->ts,' ');
      }
      (local_70.stream)->ref = (local_70.stream)->ref + 1;
      qt_QMetaEnum_debugOperator
                ((QDebug *)&local_60,(longlong)&local_68,
                 (QMetaObject *)(long)*(int *)((long)&pQVar2[5].systemPalette + 4),
                 (char *)&Qt::staticMetaObject);
      QVar3.stream = local_60.stream;
      QVar6.m_data = (storage_type *)0x1f;
      QVar6.m_size = (qsizetype)local_48;
      QString::fromUtf8(QVar6);
      QTextStream::operator<<(&(QVar3.stream)->ts,(QString *)local_48);
      if (local_48[0] != (QArrayData *)0x0) {
        LOCK();
        (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_48[0],2,0x10);
        }
      }
      if ((local_60.stream)->space == true) {
        QTextStream::operator<<(&(local_60.stream)->ts,' ');
      }
      (local_60.stream)->ref = (local_60.stream)->ref + 1;
      qt_QMetaEnum_debugOperator
                ((QDebug *)&local_50,(longlong)&local_58,(QMetaObject *)(ulong)type,
                 (char *)&QPlatformTheme::staticMetaObject);
      QDebug::~QDebug(&local_50);
      QDebug::~QDebug(&local_58);
      QDebug::~QDebug(&local_60);
      QDebug::~QDebug(&local_68);
      QDebug::~QDebug(&local_70);
    }
    pQVar4 = QPlatformTheme::palette((QPlatformTheme *)this,type);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return pQVar4;
  }
  __stack_chk_fail();
}

Assistant:

const QPalette *QKdeTheme::palette(Palette type) const
{
    Q_D(const QKdeTheme);
    if (d->hasRequestedColorScheme()) {
        qCDebug(lcQpaThemeKde) << "Current KDE theme doesn't support reuqested color scheme"
                               << d->m_requestedColorScheme << "Falling back to fusion palette:"
                               << type;
        return QPlatformTheme::palette(type);
    }

    return d->systemPalette.get();
}